

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.cpp
# Opt level: O3

void __thiscall ot::commissioner::JoinerSession::HandleConnect(JoinerSession *this,Error *aError)

{
  CommissionerHandler *pCVar1;
  pointer pcVar2;
  ErrorCode local_40 [2];
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  pCVar1 = this->mCommImpl->mCommissionerHandler;
  local_40[0] = aError->mCode;
  pcVar2 = (aError->mMessage)._M_dataplus._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar2,pcVar2 + (aError->mMessage)._M_string_length);
  (*pCVar1->_vptr_CommissionerHandler[1])(pCVar1,&this->mJoinerId,local_40);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

void JoinerSession::HandleConnect(Error aError)
{
    mCommImpl.mCommissionerHandler.OnJoinerConnected(mJoinerId, aError);
}